

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

int xmlACatalogRemove(xmlCatalogPtr catal,xmlChar *value)

{
  xmlCatalogEntryPtr catal_00;
  xmlChar *pxVar1;
  xmlGenericErrorFunc p_Var2;
  int iVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  _xmlCatalogEntry *p_Var6;
  
  iVar3 = -1;
  if (value != (xmlChar *)0x0 && catal != (xmlCatalogPtr)0x0) {
    if (catal->type == XML_XML_CATALOG_TYPE) {
      catal_00 = catal->xml;
      if ((catal_00 != (xmlCatalogEntryPtr)0x0) && ((uint)(catal_00->type + XML_CATA_REMOVED) < 2))
      {
        p_Var6 = catal_00->children;
        if (p_Var6 != (_xmlCatalogEntry *)0x0) goto LAB_0013b56e;
        xmlFetchXMLCatalogFile(catal_00);
        for (p_Var6 = catal_00->children; p_Var6 != (_xmlCatalogEntry *)0x0; p_Var6 = p_Var6->next)
        {
LAB_0013b56e:
          if (((p_Var6->name != (xmlChar *)0x0) &&
              (iVar3 = xmlStrEqual(value,p_Var6->name), iVar3 != 0)) ||
             (iVar3 = xmlStrEqual(value,p_Var6->value), iVar3 != 0)) {
            if (xmlDebugCatalogs != 0) {
              pxVar1 = p_Var6->name;
              pp_Var4 = __xmlGenericError();
              p_Var2 = *pp_Var4;
              ppvVar5 = __xmlGenericErrorContext();
              (*p_Var2)(*ppvVar5,"Removing element %s from catalog\n",
                        (&p_Var6->name)[pxVar1 == (xmlChar *)0x0]);
            }
            p_Var6->type = XML_CATA_REMOVED;
          }
        }
        iVar3 = 0;
      }
    }
    else {
      iVar3 = xmlHashRemoveEntry(catal->sgml,value,xmlFreeCatalogEntry);
      iVar3 = iVar3 + (uint)(iVar3 == 0);
    }
  }
  return iVar3;
}

Assistant:

int
xmlACatalogRemove(xmlCatalogPtr catal, const xmlChar *value) {
    int res = -1;

    if ((catal == NULL) || (value == NULL))
	return(-1);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	res = xmlDelXMLCatalog(catal->xml, value);
    } else {
	res = xmlHashRemoveEntry(catal->sgml, value, xmlFreeCatalogEntry);
	if (res == 0)
	    res = 1;
    }
    return(res);
}